

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuApp.cpp
# Opt level: O1

void __thiscall tcu::App::onCrash(App *this)

{
  deBool dVar1;
  
  dVar1 = deMutex_tryLock((this->m_crashLock).m_mutex);
  if ((dVar1 == 1) && (this->m_crashed == false)) {
    this->m_crashed = true;
    if ((this->m_testExecutor == (TestSessionExecutor *)0x0) ||
       (this->m_testExecutor->m_isInTestCase != true)) {
      qpCrashHandler_writeCrashInfo(this->m_crashHandler,writeCrashToConsole,(void *)0x0);
    }
    else {
      qpCrashHandler_writeCrashInfo(this->m_crashHandler,writeCrashToLog,this->m_testCtx->m_log);
      TestLog::terminateCase(this->m_testCtx->m_log,QP_TEST_RESULT_CRASH);
    }
    die("Test program crashed");
    return;
  }
  return;
}

Assistant:

void App::onCrash (void)
{
	// \note THIS IS CALLED BY SIGNAL HANDLER! CALLING MALLOC/FREE IS NOT ALLOWED!

	if (!m_crashLock.tryLock() || m_crashed)
		return; // In crash handler already.

	m_crashed = true;

	bool isInCase = m_testExecutor ? m_testExecutor->isInTestCase() : false;

	if (isInCase)
	{
		qpCrashHandler_writeCrashInfo(m_crashHandler, writeCrashToLog, &m_testCtx->getLog());
		m_testCtx->getLog().terminateCase(QP_TEST_RESULT_CRASH);
	}
	else
		qpCrashHandler_writeCrashInfo(m_crashHandler, writeCrashToConsole, DE_NULL);

	die("Test program crashed");
}